

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymdeltat.c
# Opt level: O0

void YM_DELTAT_synthesis_from_CPU_memory(YM_DELTAT *DELTAT)

{
  uint local_18;
  uint local_14;
  int data;
  UINT32 step;
  YM_DELTAT *DELTAT_local;
  
  DELTAT->now_step = DELTAT->step + DELTAT->now_step;
  if (0xffff < DELTAT->now_step) {
    local_14 = DELTAT->now_step >> 0x10;
    DELTAT->now_step = DELTAT->now_step & 0xffff;
    do {
      if ((DELTAT->now_addr & 1) == 0) {
        local_18 = (int)(uint)DELTAT->now_data >> 4;
      }
      else {
        local_18 = DELTAT->now_data & 0xf;
        DELTAT->now_data = DELTAT->CPU_data;
        if ((DELTAT->status_set_handler != (STATUS_CHANGE_HANDLER)0x0) &&
           (DELTAT->status_change_BRDY_bit != '\0')) {
          (*DELTAT->status_set_handler)
                    (DELTAT->status_change_which_chip,DELTAT->status_change_BRDY_bit);
        }
      }
      DELTAT->now_addr = DELTAT->now_addr + 1;
      DELTAT->prev_acc = DELTAT->acc;
      DELTAT->acc = (ym_deltat_decode_tableB1[(int)local_18] * DELTAT->adpcmd) / 8 + DELTAT->acc;
      if (DELTAT->acc < 0x8000) {
        if (DELTAT->acc < -0x8000) {
          DELTAT->acc = -0x8000;
        }
      }
      else {
        DELTAT->acc = 0x7fff;
      }
      DELTAT->adpcmd = (DELTAT->adpcmd * ym_deltat_decode_tableB2[(int)local_18]) / 0x40;
      if (DELTAT->adpcmd < 0x6001) {
        if (DELTAT->adpcmd < 0x7f) {
          DELTAT->adpcmd = 0x7f;
        }
      }
      else {
        DELTAT->adpcmd = 0x6000;
      }
      local_14 = local_14 - 1;
    } while (local_14 != 0);
  }
  DELTAT->adpcml = DELTAT->prev_acc * (0x10000 - DELTAT->now_step);
  DELTAT->adpcml = DELTAT->acc * DELTAT->now_step + DELTAT->adpcml;
  DELTAT->adpcml = (DELTAT->adpcml >> 0x10) * DELTAT->volume;
  *DELTAT->pan = DELTAT->adpcml + *DELTAT->pan;
  return;
}

Assistant:

INLINE void YM_DELTAT_synthesis_from_CPU_memory(YM_DELTAT *DELTAT)
{
	UINT32 step;
	int data;

	DELTAT->now_step += DELTAT->step;
	if ( DELTAT->now_step >= (1<<YM_DELTAT_SHIFT) )
	{
		step = DELTAT->now_step >> YM_DELTAT_SHIFT;
		DELTAT->now_step &= (1<<YM_DELTAT_SHIFT)-1;
		do{

			if( DELTAT->now_addr&1 )
			{
				data = DELTAT->now_data & 0x0f;

				DELTAT->now_data = DELTAT->CPU_data;

				/* after we used CPU_data, we set BRDY bit in status register,
				 * which means we are ready to accept another byte of data */
				if(DELTAT->status_set_handler != NULL && DELTAT->status_change_BRDY_bit)
					(DELTAT->status_set_handler)(DELTAT->status_change_which_chip, DELTAT->status_change_BRDY_bit);
			}
			else
			{
				data = DELTAT->now_data >> 4;
			}

			DELTAT->now_addr++;

			/* store accumulator value */
			DELTAT->prev_acc = DELTAT->acc;

			/* Forecast to next Forecast */
			DELTAT->acc += (ym_deltat_decode_tableB1[data] * DELTAT->adpcmd / 8);
			YM_DELTAT_Limit(DELTAT->acc,YM_DELTAT_DECODE_MAX, YM_DELTAT_DECODE_MIN);

			/* delta to next delta */
			DELTAT->adpcmd = (DELTAT->adpcmd * ym_deltat_decode_tableB2[data] ) / 64;
			YM_DELTAT_Limit(DELTAT->adpcmd,YM_DELTAT_DELTA_MAX, YM_DELTAT_DELTA_MIN );


		}while(--step);

	}

	/* ElSemi: Fix interpolator. */
	DELTAT->adpcml = DELTAT->prev_acc * (int)((1<<YM_DELTAT_SHIFT)-DELTAT->now_step);
	DELTAT->adpcml += (DELTAT->acc * (int)DELTAT->now_step);
	DELTAT->adpcml = (DELTAT->adpcml>>YM_DELTAT_SHIFT) * (int)DELTAT->volume;

	/* output for work of output channels (outd[OPNxxxx])*/
	*(DELTAT->pan) += DELTAT->adpcml;
}